

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O0

void __thiscall mp::QP2PassVisitor::QP2PassVisitor(QP2PassVisitor *this,BasicProblemFlattener *flt)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  ExprVisitor<mp::QP2PassVisitor,_int> *in_stack_ffffffffffffffb0;
  uint N;
  TMatrix<double,_16U> *this_00;
  
  ExprVisitor<mp::QP2PassVisitor,_int>::ExprVisitor(in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__QP2PassVisitor_0097bde0;
  in_RDI[1] = in_RSI;
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  *(undefined1 *)(in_RDI + 3) = 0;
  *(longdouble *)(in_RDI + 4) = (longdouble)1;
  in_RDI[6] = 0;
  *(undefined4 *)(in_RDI + 7) = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x70973d);
  N = (uint)((ulong)(in_RDI + 0xb) >> 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x709750);
  this_00 = (TMatrix<double,_16U> *)(in_RDI + 0xe);
  gch::small_vector<int,_64U,_std::allocator<int>_>::small_vector
            ((small_vector<int,_64U,_std::allocator<int>_> *)0x709763);
  gch::small_vector<int,_64U,_std::allocator<int>_>::small_vector
            ((small_vector<int,_64U,_std::allocator<int>_> *)0x709779);
  in_RDI[0x54] = 0;
  *(longdouble *)(in_RDI + 0x56) = (longdouble)0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x7097a2);
  TMatrix<double,_16U>::TMatrix(this_00,N);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7097c8);
  return;
}

Assistant:

QP2PassVisitor(BasicProblemFlattener& flt)
      : flattener_(flt) { }